

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cc
# Opt level: O0

double __thiscall Generator::MeanLogGuesses(Generator *this,char *puzzle)

{
  ostream *poVar1;
  long in_RDI;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  size_t guesses;
  int j;
  double sum_log_guesses;
  char solution [81];
  size_t *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  undefined8 uVar5;
  undefined4 in_stack_ffffffffffffff88;
  int iVar6;
  double local_70;
  
  auVar4 = ZEXT1664((undefined1  [16])0x0);
  local_70 = 0.0;
  iVar6 = 0;
  while( true ) {
    auVar3 = auVar4._0_16_;
    if (*(int *)(in_RDI + 0x24) <= iVar6) {
      if (*(int *)(in_RDI + 0x24) == 0) {
        local_70 = 0.0;
      }
      else {
        local_70 = local_70 / (double)*(int *)(in_RDI + 0x24);
      }
      return local_70;
    }
    Util::PermuteSudoku(stack0x00000080,(char *)solution._72_8_,(bool)solution[0x47]);
    uVar5 = 0;
    if (*(int *)(in_RDI + 0x30) == 1) break;
    if (*(int *)(in_RDI + 0x30) == 2) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Must build with -DGUROBI=on to use gurobi");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    TdokuSolverDpllTriadSimd
              ((char *)CONCAT44(iVar6,in_stack_ffffffffffffff88),0,(uint32_t)((ulong)in_RDI >> 0x20)
               ,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    auVar3 = vcvtusi2sd_avx512f(auVar3,uVar5);
    dVar2 = log(auVar3._0_8_ + 1.0);
    local_70 = dVar2 + local_70;
    auVar4 = ZEXT864((ulong)local_70);
    iVar6 = iVar6 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Must build with -DMINISAT=on to use minisat");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

double MeanLogGuesses(char *puzzle) {
        char solution[81];
        double sum_log_guesses = 0.0;
        for (int j = 0; j < options_.num_evals; j++) {
            util_.PermuteSudoku(puzzle, options_.pencilmark);
            size_t guesses = 0;
            if (options_.solver == 1) {
#ifdef MINISAT
                OtherSolverMiniSat(puzzle, 1, 3, solution, &guesses);
#else
                cout << "Must build with -DMINISAT=on to use minisat" << endl;
                exit(1);
#endif
            } else if (options_.solver == 2) {
#ifdef GUROBI
                OtherSolverGurobi(puzzle, 2, 0, solution, &guesses);
#else
                cout << "Must build with -DGUROBI=on to use gurobi" << endl;
                exit(1);
#endif
            } else {
                TdokuSolverDpllTriadSimd(puzzle, 1, 0, solution, &guesses);
            }
            sum_log_guesses += log((double) guesses + 1);
        }
        return options_.num_evals == 0 ? 0.0 : sum_log_guesses / options_.num_evals;
    }